

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyDfs.c
# Opt level: O1

void Ivy_ManDfs_rec(Ivy_Man_t *p,Ivy_Obj_t *pObj,Vec_Int_t *vNodes)

{
  uint uVar1;
  
  while( true ) {
    uVar1 = *(uint *)&pObj->field_0x8;
    if ((uVar1 & 0x10) != 0) {
      return;
    }
    *(uint *)&pObj->field_0x8 = uVar1 | 0x10;
    if (((pObj->Id != 0) && (uVar1 = uVar1 & 0xf, uVar1 != 1)) && (uVar1 != 4)) {
      if (2 < uVar1 - 5) {
        __assert_fail("Ivy_ObjIsBuf(pObj) || Ivy_ObjIsAnd(pObj) || Ivy_ObjIsExor(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyDfs.c"
                      ,0x3f,"void Ivy_ManDfs_rec(Ivy_Man_t *, Ivy_Obj_t *, Vec_Int_t *)");
      }
      Ivy_ManDfs_rec(p,(Ivy_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vNodes);
      if ((*(uint *)&pObj->field_0x8 & 0xf) != 7) {
        Ivy_ManDfs_rec(p,(Ivy_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),vNodes);
      }
      if ((p->pHaig == (Ivy_Man_t *)0x0) && (pObj->pEquiv != (Ivy_Obj_t *)0x0)) {
        Ivy_ManDfs_rec(p,(Ivy_Obj_t *)((ulong)pObj->pEquiv & 0xfffffffffffffffe),vNodes);
      }
      Vec_IntPush(vNodes,pObj->Id);
      return;
    }
    if (p->pHaig != (Ivy_Man_t *)0x0) {
      return;
    }
    if (pObj->pEquiv == (Ivy_Obj_t *)0x0) break;
    pObj = (Ivy_Obj_t *)((ulong)pObj->pEquiv & 0xfffffffffffffffe);
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Collects nodes in the DFS order.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Ivy_ManDfs_rec( Ivy_Man_t * p, Ivy_Obj_t * pObj, Vec_Int_t * vNodes )
{
    if ( Ivy_ObjIsMarkA(pObj) )
        return;
    Ivy_ObjSetMarkA(pObj);
    if ( Ivy_ObjIsConst1(pObj) || Ivy_ObjIsCi(pObj) )
    {
        if ( p->pHaig == NULL && pObj->pEquiv )
            Ivy_ManDfs_rec( p, Ivy_Regular(pObj->pEquiv), vNodes );
        return;
    }
//printf( "visiting node %d\n", pObj->Id );
/*
    if ( pObj->Id == 87 || pObj->Id == 90 )
    {
        int y = 0;
    }
*/
    assert( Ivy_ObjIsBuf(pObj) || Ivy_ObjIsAnd(pObj) || Ivy_ObjIsExor(pObj) );
    Ivy_ManDfs_rec( p, Ivy_ObjFanin0(pObj), vNodes );
    if ( !Ivy_ObjIsBuf(pObj) )
        Ivy_ManDfs_rec( p, Ivy_ObjFanin1(pObj), vNodes );
    if ( p->pHaig == NULL && pObj->pEquiv )
        Ivy_ManDfs_rec( p, Ivy_Regular(pObj->pEquiv), vNodes );
    Vec_IntPush( vNodes, pObj->Id );

//printf( "adding node %d with fanins %d and %d and equiv %d (refs = %d)\n", 
//       pObj->Id, Ivy_ObjFanin0(pObj)->Id, Ivy_ObjFanin1(pObj)->Id, 
//       pObj->pEquiv? Ivy_Regular(pObj->pEquiv)->Id: -1, Ivy_ObjRefs(pObj) );
}